

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

int wwCmp_fast(word *a,word *b,size_t n)

{
  size_t sVar1;
  size_t n_local;
  word *b_local;
  word *a_local;
  
  n_local = n;
  while( true ) {
    sVar1 = n_local - 1;
    if (n_local == 0) {
      return 0;
    }
    if (b[sVar1] < a[sVar1]) break;
    n_local = sVar1;
    if (a[sVar1] < b[sVar1]) {
      return -1;
    }
  }
  return 1;
}

Assistant:

int FAST(wwCmp)(const word a[], const word b[], size_t n)
{
	ASSERT(wwIsValid(a, n) && wwIsValid(b, n));
	while (n--)
		if (a[n] > b[n])
			return 1;
		else if (a[n] < b[n])
			return -1;
	return 0;
}